

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
pegmatite::Context::parse_rule(Context *this,Rule *r,offset_in_Context_to_subr parse_func)

{
  int iVar1;
  difference_type this_00;
  vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_> *this_01;
  bool bVar2;
  byte bVar3;
  reference pvVar4;
  Index ParserPosition;
  pointer ppVar5;
  size_type sVar6;
  size_type sVar7;
  iterator __last;
  offset_in_Context_to_subr in_RCX;
  long *plVar8;
  mapped_type *local_218;
  mapped_type *local_1f0;
  mapped_type *local_1c8;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  local_168;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  local_160;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  local_158;
  const_iterator local_150;
  ulong local_148;
  difference_type index;
  vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  *cached_matches_1;
  mapped_type *new_cache;
  RuleState local_120;
  RuleState local_110;
  size_type local_100;
  size_t new_match_index;
  ParseMatch *local_e0;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  local_d8;
  __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
  local_d0;
  const_iterator local_c8;
  undefined1 local_c0 [8];
  vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  cached_matches;
  _Node_iterator_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
  local_a0;
  iterator cache_entry;
  CacheKey k;
  bool lr;
  size_t new_pos;
  bool ok;
  value_type *last;
  size_t sStack_58;
  MatchMode last_mode;
  size_t last_pos;
  vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_> *local_48;
  mapped_type *states;
  offset_in_Context_to_subr parse_func_local;
  _Node_iterator_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
  local_30;
  Rule *r_local;
  Context *this_local;
  byte local_9;
  
  last_pos = (size_t)r;
  states = (mapped_type *)parse_func;
  parse_func_local = in_RCX;
  local_30._M_cur = (__node_type *)r;
  r_local = (Rule *)this;
  this_local = (Context *)parse_func;
  local_48 = std::
             unordered_map<const_pegmatite::Rule_*,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>,_std::hash<const_pegmatite::Rule_*>,_std::equal_to<const_pegmatite::Rule_*>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>_>
             ::operator[](&this->rule_states,(key_type *)&last_pos);
  sStack_58 = 0xffffffffffffffff;
  last._4_4_ = PARSE;
  bVar2 = std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>
          ::empty(local_48);
  if (!bVar2) {
    pvVar4 = std::
             vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
             back(local_48);
    sStack_58 = pvVar4->position;
    last._4_4_ = pvVar4->mode;
  }
  ParserPosition = Input::iterator::operator-(&(this->position).it,&this->start);
  cache_entry.
  super__Node_iterator_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
               )local_30._M_cur;
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_map<pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>,_pegmatite::Context::CacheKeyHash,_std::equal_to<pegmatite::Context::CacheKey>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>_>
       ::find(&this->cache,(key_type *)&cache_entry);
  cached_matches.
  super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                unordered_map<pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>,_pegmatite::Context::CacheKeyHash,_std::equal_to<pegmatite::Context::CacheKey>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>_>
                ::end(&this->cache);
  bVar2 = std::__detail::operator!=
                    (&local_a0,
                     (_Node_iterator_base<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_true>
                      *)&cached_matches.
                         super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_false,_true>
                           *)&local_a0);
    std::
    vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>::
    vector((vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
            *)local_c0,&(ppVar5->second).second);
    local_d0._M_current =
         (ParseMatch *)
         std::
         vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ::end(&this->matches);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::ParseMatch_const*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>
    ::__normal_iterator<(anonymous_namespace)::ParseMatch*>
              ((__normal_iterator<(anonymous_namespace)::ParseMatch_const*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>
                *)&local_c8,&local_d0);
    local_d8._M_current =
         (ParseMatch *)
         std::
         vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
         ::begin((vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                  *)local_c0);
    local_e0 = (ParseMatch *)
               std::
               vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
               ::end((vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                      *)local_c0);
    new_match_index =
         (size_t)std::
                 vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                 ::
                 insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ParseMatch*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>,void>
                           ((vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                             *)&this->matches,local_c8,local_d8,
                            (__normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
                             )local_e0);
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_false,_true>
                           *)&local_a0);
    (this->position).it.buffer = (ppVar5->second).first.it.buffer;
    (this->position).it.idx = (ppVar5->second).first.it.idx;
    iVar1 = (ppVar5->second).first.col;
    (this->position).line = (ppVar5->second).first.line;
    (this->position).col = iVar1;
    local_9 = 1;
    std::
    vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>::
    ~vector((vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
             *)local_c0);
  }
  else {
    local_100 = std::
                vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                ::size(&this->matches);
    this_01 = local_48;
    if (last._4_4_ == PARSE) {
      if (ParserPosition != sStack_58) {
        RuleState::RuleState(&local_120,ParserPosition,PARSE);
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        push_back(this_01,&local_120);
        plVar8 = (long *)((long)&this->whitespace_rule + parse_func_local);
        if (((ulong)states & 1) == 0) {
          local_1f0 = states;
        }
        else {
          local_1f0 = *(mapped_type **)((long)states + *plVar8 + -1);
        }
        bVar3 = (*(code *)local_1f0)(plVar8,local_30._M_cur);
        new_pos._7_1_ = bVar3 & 1;
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        pop_back(local_48);
      }
      else {
        RuleState::RuleState(&local_110,ParserPosition,REJECT);
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        push_back(this_01,&local_110);
        plVar8 = (long *)((long)&this->whitespace_rule + parse_func_local);
        if (((ulong)states & 1) == 0) {
          local_1c8 = states;
        }
        else {
          local_1c8 = *(mapped_type **)((long)states + *plVar8 + -1);
        }
        bVar3 = (*(code *)local_1c8)(plVar8,local_30._M_cur);
        new_pos._7_1_ = bVar3 & 1;
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        pop_back(local_48);
      }
    }
    else if (last._4_4_ == REJECT) {
      if (ParserPosition != sStack_58) {
        RuleState::RuleState((RuleState *)&new_cache,ParserPosition,PARSE);
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        push_back(this_01,(RuleState *)&new_cache);
        plVar8 = (long *)((long)&this->whitespace_rule + parse_func_local);
        if (((ulong)states & 1) == 0) {
          local_218 = states;
        }
        else {
          local_218 = *(mapped_type **)((long)states + *plVar8 + -1);
        }
        bVar3 = (*(code *)local_218)(plVar8,local_30._M_cur);
        new_pos._7_1_ = bVar3 & 1;
        std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>::
        pop_back(local_48);
      }
      else {
        new_pos._7_1_ = 0;
      }
    }
    if ((new_pos._7_1_ & 1) != 0) {
      sVar6 = std::
              unordered_map<pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>,_pegmatite::Context::CacheKeyHash,_std::equal_to<pegmatite::Context::CacheKey>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>_>
              ::size(&this->cache);
      if (0x100 < sVar6) {
        std::
        unordered_map<pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>,_pegmatite::Context::CacheKeyHash,_std::equal_to<pegmatite::Context::CacheKey>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>_>
        ::clear(&this->cache);
      }
      cached_matches_1 =
           (vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
            *)std::
              unordered_map<pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>,_pegmatite::Context::CacheKeyHash,_std::equal_to<pegmatite::Context::CacheKey>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>_>
              ::operator[](&this->cache,(key_type *)&cache_entry);
      (((mapped_type *)cached_matches_1)->first).it.buffer = (this->position).it.buffer;
      (((mapped_type *)cached_matches_1)->first).it.idx = (this->position).it.idx;
      iVar1 = (this->position).col;
      (((mapped_type *)cached_matches_1)->first).line = (this->position).line;
      (((mapped_type *)cached_matches_1)->first).col = iVar1;
      index = (difference_type)&((mapped_type *)cached_matches_1)->second;
      std::
      vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ::clear((vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
               *)index);
      sVar7 = std::
              vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
              ::size(&this->matches);
      this_00 = index;
      if (local_100 < sVar7) {
        local_148 = local_100;
        local_158._M_current =
             (ParseMatch *)
             std::
             vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
             ::begin((vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                      *)index);
        __gnu_cxx::
        __normal_iterator<(anonymous_namespace)::ParseMatch_const*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>
        ::__normal_iterator<(anonymous_namespace)::ParseMatch*>
                  ((__normal_iterator<(anonymous_namespace)::ParseMatch_const*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>
                    *)&local_150,&local_158);
        local_168._M_current =
             (ParseMatch *)
             std::
             vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
             ::begin(&this->matches);
        local_160 = __gnu_cxx::
                    __normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
                    ::operator+(&local_168,local_148);
        __last = std::
                 vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                 ::end(&this->matches);
        std::
        vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::ParseMatch*,std::vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>>,void>
                  ((vector<(anonymous_namespace)::ParseMatch,std::allocator<(anonymous_namespace)::ParseMatch>>
                    *)this_00,local_150,local_160,
                   (__normal_iterator<(anonymous_namespace)::ParseMatch_*,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>
                    )__last._M_current);
      }
    }
    local_9 = new_pos._7_1_ & 1;
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool Context::parse_rule(const Rule &r, bool (Context::*parse_func)(const Rule &))
{
	// For each rule, we maintain a vector consisting of where it was last
	// encountered (in the input stream) and what the parsing mode was.
	auto &states = rule_states[std::addressof(r)];
	// If this is the first time that we've encountered this rule, then set the
	// last position and mode to values that will trigger a normal parse: We
	// can't be in left recursion if this is the first time that we've
	// encountered the rule.
	size_t last_pos = Input::npos;
	MatchMode last_mode = MatchMode::PARSE;
	if (!states.empty())
	{
		auto &last = states.back();
		last_pos = last.position;
		last_mode = last.mode;
	}
	// Return value (success or failure of parse)
	bool ok;

	// Compute the new position in the stream.  We're only tracking offsets to
	// detect left recursion, not storing iterators.
	size_t new_pos = position.it - start;

	// Check if we have left recursion.  We are in a left-recursive state if
	// the last time that we encountered this rule was at the same point in the
	// input.
	bool lr = new_pos == last_pos;

	// Look up the current rule and parser position in the cache to see if
	// we've been here before and successfully parsed the rule.
	CacheKey k = { std::addressof(r), position.it };
	auto cache_entry = cache.find(k);
	if (cache_entry != cache.end())
	{
		// If we have a cache entry then grab the list of matched rules and the
		// end parsing position from the cache and don't bother trying to apply
		// the rules again.
		auto cached_matches = cache_entry->second.second;
		matches.insert(matches.end(), cached_matches.begin(), cached_matches.end());
		position = cache_entry->second.first;
		return true;
	}

	size_t new_match_index = matches.size();

	switch (last_mode)
	{
		//normal parse
		case MatchMode::PARSE:
			if (lr)
			{
				//first try to parse the rule by rejecting it, so alternative
				//branches are examined
				states.push_back(RuleState(new_pos, MatchMode::REJECT));
				ok = (this->*parse_func)(r);
				states.pop_back();
				break;
			}
			else
			{
				states.push_back(RuleState(new_pos, MatchMode::PARSE));
				ok = (this->*parse_func)(r);
				states.pop_back();
			}
			break;
		case MatchMode::REJECT:
			if (lr)
			{
				ok = false;
			}
			else
			{
				states.push_back(RuleState(new_pos, MatchMode::PARSE));
				ok = (this->*parse_func)(r);
				states.pop_back();
			}
			break;
	}

	// If we successfully parsed the input, then cache the result.
	if (ok)
	{
		// To prevent the cache growing too large, if it starts to get quite
		// big, delete everything.  256is a mostly arbitrary number generated
		// by running a big(ish) parse with a few different values and finding
		// the place where the increase in memory didn't come with a noticeable
		// speedup.
		if (cache.size() > 256)
		{
			cache.clear();
		}
		// Insert the new cache entry
		auto &new_cache = cache[k];
		new_cache.first = position;
		auto &cached_matches = new_cache.second;
		cached_matches.clear();
		// If there some rules were matched, record them
		if (matches.size() > new_match_index)
		{
			const auto index =
				static_cast<Input::iterator::difference_type>(new_match_index);
			cached_matches.insert(cached_matches.begin(), matches.begin() +
					index, matches.end());
		}
	}

	return ok;
}